

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_context.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::SourceContext::_InternalParse(SourceContext *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  byte bVar2;
  internal *this_01;
  char *size;
  bool bVar3;
  char *in_RCX;
  UnknownFieldSet *unknown;
  Arena *arena;
  byte *pbVar4;
  uint res;
  string *s;
  ArenaStringPtr *this_02;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar5;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_02 = &this->file_name_;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    pbVar4 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      bVar2 = *pbVar4;
      in_RCX = (char *)((ulong)bVar2 << 7);
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar5 = internal::ReadTagFallback((char *)local_38,res);
        pbVar4 = (byte *)pVar5.first;
        if (pbVar4 == (byte *)0x0) {
          return (char *)0x0;
        }
        res = pVar5.second;
      }
      else {
        pbVar4 = local_38 + 2;
      }
    }
    local_38 = pbVar4;
    if (res == 10) {
      arena = (Arena *)this_00->ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      s = this_02->ptr_;
      if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_02,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        s = this_02->ptr_;
      }
      local_38 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_38,ctx);
      this_01 = (internal *)(s->_M_dataplus)._M_p;
      size = (char *)s->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      str.length_ = (stringpiece_ssize_type)"google.protobuf.SourceContext.file_name";
      str.ptr_ = size;
      bVar3 = internal::VerifyUTF8(this_01,str,in_RCX);
      if (!bVar3) {
        return (char *)0x0;
      }
      in_RCX = (char *)(ulong)((uint)(local_38 == (byte *)0x0) * 2 + 2);
    }
    else {
      if ((res == 0) || ((res & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pbVar4;
      }
      if (((ulong)this_00->ptr_ & 1) == 0) {
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
      }
      else {
        unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
      }
      local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
      in_RCX = (char *)0x2;
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    if ((int)in_RCX != 2) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* SourceContext::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string file_name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_file_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.SourceContext.file_name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}